

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,int n)

{
  ImGuiID id;
  uint *puVar1;
  int n_local;
  
  n_local = n;
  puVar1 = ImVector<unsigned_int>::back(&this->IDStack);
  id = ImHashData(&n_local,4,*puVar1);
  if (GImGui->DebugHookIdInfo == id) {
    ImGui::DebugHookIdInfo(id,4,(void *)(long)n,(void *)0x0);
  }
  return id;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(int n)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_S32, (void*)(intptr_t)n, NULL);
    return id;
}